

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_uint.h
# Opt level: O0

bool __thiscall jbcoin::base_uint<128UL,_void>::SetHexExact(base_uint<128UL,_void> *this,char *psz)

{
  int iVar1;
  int iVar2;
  uchar *puVar3;
  int lo;
  int hi;
  int i;
  uchar *pOut;
  char *psz_local;
  base_uint<128UL,_void> *this_local;
  
  _hi = begin(this);
  lo = 0;
  pOut = (uchar *)psz;
  while( true ) {
    if (0xf < (uint)lo) {
      return *pOut == '\0';
    }
    puVar3 = pOut + 1;
    iVar1 = charUnHex(*pOut);
    if (iVar1 == -1) break;
    pOut = pOut + 2;
    iVar2 = charUnHex(*puVar3);
    if (iVar2 == -1) {
      return false;
    }
    *_hi = (byte)(iVar1 << 4) | (byte)iVar2;
    lo = lo + 1;
    _hi = _hi + 1;
  }
  return false;
}

Assistant:

bool SetHexExact (const char* psz)
    {
        unsigned char* pOut  = begin ();

        assert(sizeof(pn) == bytes);
        for (int i = 0; i < sizeof (pn); ++i)
        {
            auto hi = charUnHex(*psz++);
            if (hi == -1)
                return false;

            auto lo = charUnHex (*psz++);
            if (lo == -1)
                return false;

            *pOut++ = (hi << 4) | lo;
        }

        // We've consumed exactly as many bytes as we needed at this point
        // so we should be at the end of the string.
        return (*psz == 0);
    }